

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O3

string * IOcontroller::get_out_file_name_budget
                   (string *__return_storage_ptr__,string *graphName,string *algName,
                   double budpercent,double normalpha,double percent,double eps,double feps,
                   string *probDist,float probEdge)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  undefined8 uStack_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  undefined8 uStack_2a8;
  ulong *local_2a0;
  long local_298;
  ulong local_290;
  undefined8 uStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  undefined8 uStack_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  undefined8 uStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  undefined8 uStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  long *local_1a0;
  undefined8 local_198;
  long local_190;
  undefined8 uStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  float local_9c;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_9c = probEdge;
  local_98 = feps;
  local_90 = eps;
  local_88 = percent;
  local_80 = normalpha;
  local_78 = budpercent;
  iVar3 = std::__cxx11::string::compare((char *)probDist);
  if (iVar3 == 0) {
    pcVar1 = (graphName->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + graphName->_M_string_length);
    std::__cxx11::string::append((char *)&local_e0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)(algName->_M_dataplus)._M_p);
    local_c0 = &local_b0;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_b0._M_allocated_capacity = *puVar6;
      local_b0._8_8_ = plVar4[3];
    }
    else {
      local_b0._M_allocated_capacity = *puVar6;
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar4;
    }
    local_b8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_1b0 = *puVar6;
      lStack_1a8 = plVar4[3];
      local_1c0 = &local_1b0;
    }
    else {
      local_1b0 = *puVar6;
      local_1c0 = (ulong *)*plVar4;
    }
    local_1b8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_120,vsnprintf,0x148,"%f",SUB84(local_78,0));
    uVar8 = 0xf;
    if (local_1c0 != &local_1b0) {
      uVar8 = local_1b0;
    }
    if (uVar8 < local_120._M_string_length + local_1b8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        uVar9 = local_120.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_120._M_string_length + local_1b8) goto LAB_0011f343;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_1c0);
    }
    else {
LAB_0011f343:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_120._M_dataplus._M_p)
      ;
    }
    local_2e0 = &local_2d0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_2d0 = *puVar6;
      uStack_2c8 = puVar5[3];
    }
    else {
      local_2d0 = *puVar6;
      local_2e0 = (ulong *)*puVar5;
    }
    local_2d8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_2b0 = *puVar6;
      uStack_2a8 = puVar5[3];
      local_2c0 = &local_2b0;
    }
    else {
      local_2b0 = *puVar6;
      local_2c0 = (ulong *)*puVar5;
    }
    local_2b8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_140,vsnprintf,0x148,"%f",SUB84(local_80,0));
    uVar8 = 0xf;
    if (local_2c0 != &local_2b0) {
      uVar8 = local_2b0;
    }
    if (uVar8 < local_140._M_string_length + local_2b8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar9 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_140._M_string_length + local_2b8) goto LAB_0011f47d;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_2c0);
    }
    else {
LAB_0011f47d:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_140._M_dataplus._M_p)
      ;
    }
    local_2a0 = &local_290;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_290 = *puVar6;
      uStack_288 = puVar5[3];
    }
    else {
      local_290 = *puVar6;
      local_2a0 = (ulong *)*puVar5;
    }
    local_298 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_270 = *puVar6;
      uStack_268 = puVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *puVar6;
      local_280 = (ulong *)*puVar5;
    }
    local_278 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_160,vsnprintf,0x148,"%f",SUB84(local_88,0));
    uVar8 = 0xf;
    if (local_280 != &local_270) {
      uVar8 = local_270;
    }
    if (uVar8 < local_160._M_string_length + local_278) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        uVar9 = local_160.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_160._M_string_length + local_278) goto LAB_0011f5b4;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_280);
    }
    else {
LAB_0011f5b4:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_160._M_dataplus._M_p)
      ;
    }
    local_260 = &local_250;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_250 = *puVar6;
      uStack_248 = puVar5[3];
    }
    else {
      local_250 = *puVar6;
      local_260 = (ulong *)*puVar5;
    }
    local_258 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_230 = *puVar6;
      uStack_228 = puVar5[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *puVar6;
      local_240 = (ulong *)*puVar5;
    }
    local_238 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_180,vsnprintf,0x148,"%f",SUB84(local_90,0));
    uVar8 = 0xf;
    if (local_240 != &local_230) {
      uVar8 = local_230;
    }
    if (uVar8 < local_180._M_string_length + local_238) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        uVar9 = local_180.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_180._M_string_length + local_238) goto LAB_0011f70f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_240);
    }
    else {
LAB_0011f70f:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_180._M_dataplus._M_p)
      ;
    }
    local_220 = &local_210;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_210 = *puVar6;
      uStack_208 = puVar5[3];
    }
    else {
      local_210 = *puVar6;
      local_220 = (ulong *)*puVar5;
    }
    local_218 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_220);
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_1f0 = *puVar6;
      uStack_1e8 = puVar5[3];
      local_200 = &local_1f0;
    }
    else {
      local_1f0 = *puVar6;
      local_200 = (ulong *)*puVar5;
    }
    local_1f8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_50,vsnprintf,0x148,"%f",SUB84(local_98,0));
    uVar8 = 0xf;
    if (local_200 != &local_1f0) {
      uVar8 = local_1f0;
    }
    if (uVar8 < local_50._M_string_length + local_1f8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar9 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_50._M_string_length + local_1f8) goto LAB_0011f86f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_200);
    }
    else {
LAB_0011f86f:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_50._M_dataplus._M_p);
    }
    local_1e0 = &local_1d0;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_1d0 = *puVar6;
      uStack_1c8 = puVar5[3];
    }
    else {
      local_1d0 = *puVar6;
      local_1e0 = (ulong *)*puVar5;
    }
    local_1d8 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_190 = *plVar4;
      uStack_188 = puVar5[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar4;
      local_1a0 = (long *)*puVar5;
    }
    local_198 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1a0,(ulong)(probDist->_M_dataplus)._M_p);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_f0 = *puVar6;
      lStack_e8 = plVar4[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *puVar6;
      local_100 = (ulong *)*plVar4;
    }
    local_f8 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_70,vsnprintf,0x3a,"%f",SUB84((double)local_9c,0));
    uVar8 = 0xf;
    if (local_100 != &local_f0) {
      uVar8 = local_f0;
    }
    if (uVar8 < local_70._M_string_length + local_f8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar9 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_70._M_string_length + local_f8) goto LAB_0011fa36;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_100);
    }
    else {
LAB_0011fa36:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_70._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar7) {
      uVar9 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
    }
    _Var10._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0011fd01;
  }
  pcVar1 = (graphName->_M_dataplus)._M_p;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + graphName->_M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)(algName->_M_dataplus)._M_p);
  local_1c0 = &local_1b0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1b0 = *puVar6;
    lStack_1a8 = plVar4[3];
  }
  else {
    local_1b0 = *puVar6;
    local_1c0 = (ulong *)*plVar4;
  }
  local_1b8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_2d0 = *puVar6;
    uStack_2c8 = puVar5[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0 = *puVar6;
    local_2e0 = (ulong *)*puVar5;
  }
  local_2d8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_e0,vsnprintf,0x148,"%f",SUB84(local_78,0));
  uVar8 = 0xf;
  if (local_2e0 != &local_2d0) {
    uVar8 = local_2d0;
  }
  if (uVar8 < local_e0._M_string_length + local_2d8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar9 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_e0._M_string_length + local_2d8) goto LAB_0011e99d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_2e0);
  }
  else {
LAB_0011e99d:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_e0._M_dataplus._M_p);
  }
  local_2c0 = &local_2b0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_2b0 = *puVar6;
    uStack_2a8 = puVar5[3];
  }
  else {
    local_2b0 = *puVar6;
    local_2c0 = (ulong *)*puVar5;
  }
  local_2b8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_290 = *puVar6;
    uStack_288 = puVar5[3];
    local_2a0 = &local_290;
  }
  else {
    local_290 = *puVar6;
    local_2a0 = (ulong *)*puVar5;
  }
  local_298 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_120,vsnprintf,0x148,"%f",SUB84(local_80,0));
  uVar8 = 0xf;
  if (local_2a0 != &local_290) {
    uVar8 = local_290;
  }
  if (uVar8 < local_120._M_string_length + local_298) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      uVar9 = local_120.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_120._M_string_length + local_298) goto LAB_0011ead4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_0011ead4:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_120._M_dataplus._M_p);
  }
  local_280 = &local_270;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_270 = *puVar6;
    uStack_268 = puVar5[3];
  }
  else {
    local_270 = *puVar6;
    local_280 = (ulong *)*puVar5;
  }
  local_278 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_250 = *puVar6;
    uStack_248 = puVar5[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar6;
    local_260 = (ulong *)*puVar5;
  }
  local_258 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_140,vsnprintf,0x148,"%f",SUB84(local_88,0));
  uVar8 = 0xf;
  if (local_260 != &local_250) {
    uVar8 = local_250;
  }
  if (uVar8 < local_140._M_string_length + local_258) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar9 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_140._M_string_length + local_258) goto LAB_0011ec20;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_0011ec20:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_140._M_dataplus._M_p);
  }
  local_240 = &local_230;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_230 = *puVar6;
    uStack_228 = puVar5[3];
  }
  else {
    local_230 = *puVar6;
    local_240 = (ulong *)*puVar5;
  }
  local_238 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_210 = *puVar6;
    uStack_208 = puVar5[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *puVar6;
    local_220 = (ulong *)*puVar5;
  }
  local_218 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_160,vsnprintf,0x148,"%f",SUB84(local_90,0));
  uVar8 = 0xf;
  if (local_220 != &local_210) {
    uVar8 = local_210;
  }
  if (uVar8 < local_160._M_string_length + local_218) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      uVar9 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_160._M_string_length + local_218) goto LAB_0011ed7e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_0011ed7e:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_160._M_dataplus._M_p);
  }
  local_200 = &local_1f0;
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_1f0 = *puVar6;
    uStack_1e8 = puVar5[3];
  }
  else {
    local_1f0 = *puVar6;
    local_200 = (ulong *)*puVar5;
  }
  local_1f8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_200);
  puVar6 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar6) {
    local_1d0 = *puVar6;
    uStack_1c8 = puVar5[3];
    local_1e0 = &local_1d0;
  }
  else {
    local_1d0 = *puVar6;
    local_1e0 = (ulong *)*puVar5;
  }
  local_1d8 = puVar5[1];
  *puVar5 = puVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_180,vsnprintf,0x148,"%f",SUB84(local_98,0));
  uVar8 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar8 = local_1d0;
  }
  if (uVar8 < local_180._M_string_length + local_1d8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      uVar9 = local_180.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_180._M_string_length + local_1d8) goto LAB_0011eede;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_0011eede:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_180._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_190 = *plVar4;
    uStack_188 = puVar5[3];
  }
  else {
    local_190 = *plVar4;
    local_1a0 = (long *)*puVar5;
  }
  local_198 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_f0 = *puVar6;
    lStack_e8 = plVar4[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar6;
    local_100 = (ulong *)*plVar4;
  }
  local_f8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,(ulong)(probDist->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  local_e0.field_2._M_allocated_capacity = local_b0._M_allocated_capacity;
  _Var10._M_p = (pointer)local_c0;
  if (local_c0 == &local_b0) {
    return __return_storage_ptr__;
  }
LAB_0011fd01:
  operator_delete(_Var10._M_p,local_e0.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name_budget(const std::string graphName, const std::string algName,
            const double budpercent, const double normalpha, const double percent, const double eps,
            const double feps, const std::string probDist, const float probEdge) {
        if (probDist == "UNI") {
            return graphName + "_" + algName + "_" + std::to_string(budpercent) +
                   "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
                   "_" + std::to_string(eps) + "_" + std::to_string(feps) +
                   "_" + probDist + std::to_string(probEdge);
        }
        return graphName + "_" + algName + "_" + std::to_string(budpercent) +
               "_" + std::to_string(normalpha) + "_" + std::to_string(percent) +
               "_" + std::to_string(eps) + "_" + std::to_string(feps) + "_" + probDist;
    }